

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O0

void nsync::wake_waiters(nsync_dll_list_ to_wake_list,int all_readers)

{
  void *pvVar1;
  bool bVar2;
  uint o;
  int iVar3;
  nsync_dll_element_ *pnVar4;
  nsync_dll_element_ *pnVar5;
  nsync_dll_list_ pnVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool local_82;
  nsync_waiter_s *p_nw_1;
  waiter *p_w;
  nsync_waiter_s *p_nw;
  int p_is_writer;
  int woke_areader;
  int transferred_a_writer;
  int first_is_writer;
  uint32_t set_on_release;
  int first_cant_acquire;
  uint32_t old_mu_word;
  nsync_mu *pmu;
  waiter *first_w;
  nsync_waiter_s *first_nw;
  nsync_dll_element_ *first_waiter;
  nsync_dll_element_ *next;
  nsync_dll_element_ *p;
  nsync_dll_list_ pnStack_10;
  int all_readers_local;
  nsync_dll_list_ to_wake_list_local;
  
  pnVar4 = nsync_dll_first_(to_wake_list);
  pmu = (nsync_mu *)0x0;
  _first_cant_acquire = (atomic<unsigned_int> *)0x0;
  if ((*(uint *)((long)pnVar4->container + 0x30) & 1) != 0) {
    pmu = (nsync_mu *)((long)pnVar4->container + -0x108);
    _first_cant_acquire = *(atomic<unsigned_int> **)((long)pnVar4->container + 0x38);
  }
  pnStack_10 = to_wake_list;
  if (_first_cant_acquire != (atomic<unsigned_int> *)0x0) {
    o = std::atomic_load_explicit<unsigned_int>(_first_cant_acquire,memory_order_relaxed);
    bVar7 = (o & *(uint *)&(pmu[0x14].waiters)->next) != 0;
    pnVar5 = nsync_dll_next_(to_wake_list,pnVar4);
    if (((((o & 0xffffff01) != 0) && ((o & 2) == 0)) &&
        ((bVar7 || ((pnVar5 != (nsync_dll_element_ *)0x0 && (all_readers == 0)))))) &&
       (iVar3 = atm_cas_acq_u32_(_first_cant_acquire,o,o & 0xffffff7f | 6), iVar3 != 0)) {
      transferred_a_writer = 0;
      bVar8 = pmu[0x14].waiters == (nsync_dll_element_s_ *)nsync_writer_type_;
      bVar9 = !bVar7;
      if (!bVar9) {
        pnStack_10 = nsync_dll_remove_(to_wake_list,pnVar4);
        pnVar6 = nsync_dll_make_last_in_list_(*(nsync_dll_list_ *)(_first_cant_acquire + 2),pnVar4);
        *(nsync_dll_list_ *)(_first_cant_acquire + 2) = pnVar6;
        *(undefined8 *)(pmu + 0x14) = 0;
      }
      bVar2 = bVar9 && !bVar8;
      local_82 = !bVar9 && bVar8;
      while (first_waiter = pnVar5, first_waiter != (nsync_dll_element_ *)0x0) {
        p_nw_1 = (nsync_waiter_s *)0x0;
        if ((*(uint *)((long)first_waiter->container + 0x30) & 1) != 0) {
          p_nw_1 = (nsync_waiter_s *)((long)first_waiter->container + -0x108);
        }
        pnVar5 = nsync_dll_next_(pnStack_10,first_waiter);
        if (p_nw_1 != (nsync_waiter_s *)0x0) {
          bVar9 = *(undefined **)((long)first_waiter->container + 0x40) == nsync_writer_type_;
          if (((bVar7) || (bVar8)) || (bVar9)) {
            pnStack_10 = nsync_dll_remove_(pnStack_10,first_waiter);
            pnVar6 = nsync_dll_make_last_in_list_
                               (*(nsync_dll_list_ *)(_first_cant_acquire + 2),first_waiter);
            *(nsync_dll_list_ *)(_first_cant_acquire + 2) = pnVar6;
            p_nw_1[5].sem = (nsync_semaphore_s_ *)0x0;
            local_82 = local_82 || bVar9;
          }
          else {
            bVar2 = bVar2 || !bVar9;
          }
        }
      }
      if ((local_82) && (!bVar2)) {
        transferred_a_writer = 0x20;
      }
      set_on_release =
           std::atomic_load_explicit<unsigned_int>(_first_cant_acquire,memory_order_relaxed);
      while (iVar3 = atm_cas_rel_u32_(_first_cant_acquire,set_on_release,
                                      set_on_release & 0xfffffffd | transferred_a_writer),
            iVar3 == 0) {
        set_on_release =
             std::atomic_load_explicit<unsigned_int>(_first_cant_acquire,memory_order_relaxed);
      }
    }
  }
  next = nsync_dll_first_(pnStack_10);
  while (next != (nsync_dll_element_ *)0x0) {
    pvVar1 = next->container;
    pnVar4 = nsync_dll_next_(pnStack_10,next);
    pnStack_10 = nsync_dll_remove_(pnStack_10,next);
    std::atomic_store_explicit<unsigned_int>
              ((atomic<unsigned_int> *)((long)pvVar1 + 0x20),0,memory_order_release);
    nsync_mu_semaphore_v(*(nsync_semaphore **)((long)pvVar1 + 0x28));
    next = pnVar4;
  }
  return;
}

Assistant:

static void wake_waiters (nsync_dll_list_ to_wake_list, int all_readers) {
	nsync_dll_element_ *p = NULL;
	nsync_dll_element_ *next = NULL;
	nsync_dll_element_ *first_waiter = nsync_dll_first_ (to_wake_list);
	struct nsync_waiter_s *first_nw = DLL_NSYNC_WAITER (first_waiter);
	waiter *first_w = NULL;
	nsync_mu *pmu = NULL;
	if ((first_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
		first_w = DLL_WAITER (first_waiter);
		pmu = first_w->cv_mu;
	}
	if (pmu != NULL) { /* waiter is associated with the nsync_mu *pmu. */
		/* We will transfer elements of to_wake_list to *pmu if all of:
		    - some thread holds the lock, and
		    - *pmu's spinlock is not held, and
		    - either *pmu cannot be acquired in the mode of the first
		      waiter, or there's more than one thread on to_wake_list
		      and not all are readers, and
		    - we acquire the spinlock on the first try.
		   The spinlock acquisition also marks *pmu as having waiters.
		   The requirement that some thread holds the lock ensures
		   that at least one of the transferred waiters will be woken.
		   */
		uint32_t old_mu_word = ATM_LOAD (&pmu->word);
		int first_cant_acquire = ((old_mu_word & first_w->l_type->zero_to_acquire) != 0);
		next = nsync_dll_next_ (to_wake_list, first_waiter);
		if ((old_mu_word&MU_ANY_LOCK) != 0 &&
		    (old_mu_word&MU_SPINLOCK) == 0 &&
		    (first_cant_acquire || (next != NULL && !all_readers)) &&
		    ATM_CAS_ACQ (&pmu->word, old_mu_word,
				 (old_mu_word|MU_SPINLOCK|MU_WAITING) &
				 ~MU_ALL_FALSE)) {

			uint32_t set_on_release = 0;

			/* For any waiter that should be transferred, rather
			   than woken, move it from to_wake_list to pmu->waiters. */
			int first_is_writer = first_w->l_type == nsync_writer_type_;
			int transferred_a_writer = 0;
			int woke_areader = 0;
			/* Transfer the first waiter iff it can't acquire *pmu. */
			if (first_cant_acquire) {
				to_wake_list = nsync_dll_remove_ (to_wake_list, first_waiter);
				pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, first_waiter);
				/* tell nsync_cv_wait_with_deadline() that we
				   moved the waiter to *pmu's queue.  */
				first_w->cv_mu = NULL;
				/* first_nw.waiting is already 1, from being on
				   cv's waiter queue.  */
				transferred_a_writer = first_is_writer;
			} else {
				woke_areader = !first_is_writer;
			}
			/* Now process the other waiters. */
			for (p = next; p != NULL; p = next) {
				int p_is_writer;
				struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
				waiter *p_w = NULL;
				if ((p_nw->flags & NSYNC_WAITER_FLAG_MUCV) != 0) {
					p_w = DLL_WAITER (p);
				}
				next = nsync_dll_next_ (to_wake_list, p);
				p_is_writer = (p_w != NULL &&
					       DLL_WAITER (p)->l_type == nsync_writer_type_);
				/* We transfer this element if any of:
				   - the first waiter can't acquire *pmu, or
				   - the first waiter is a writer, or
				   - this element is a writer. */
				if (p_w == NULL) {
					/* wake non-native waiter */
				} else if (first_cant_acquire || first_is_writer || p_is_writer) {
					to_wake_list = nsync_dll_remove_ (to_wake_list, p);
					pmu->waiters = nsync_dll_make_last_in_list_ (pmu->waiters, p);
					/* tell nsync_cv_wait_with_deadline()
					   that we moved the waiter to *pmu's
					   queue.  */
					p_w->cv_mu = NULL;
					/* p_nw->waiting is already 1, from
					   being on cv's waiter queue.  */
					transferred_a_writer = transferred_a_writer || p_is_writer;
				} else {
					woke_areader = woke_areader || !p_is_writer;
				}
			}

			/* Claim a waiting writer if we transferred one, except if we woke readers,
			   in which case we want those readers to be able to acquire immediately. */
			if (transferred_a_writer && !woke_areader) {
				set_on_release |= MU_WRITER_WAITING;
			}

			/* release *pmu's spinlock  (MU_WAITING was set by CAS above) */
			old_mu_word = ATM_LOAD (&pmu->word);
			while (!ATM_CAS_REL (&pmu->word, old_mu_word,
					     (old_mu_word|set_on_release) & ~MU_SPINLOCK)) {
				old_mu_word = ATM_LOAD (&pmu->word);
			}
		}
	}

	/* Wake any waiters we didn't manage to enqueue on the mu. */
	for (p = nsync_dll_first_ (to_wake_list); p != NULL; p = next) {
		struct nsync_waiter_s *p_nw = DLL_NSYNC_WAITER (p);
		next = nsync_dll_next_ (to_wake_list, p);
		to_wake_list = nsync_dll_remove_ (to_wake_list, p);
		/* Wake the waiter. */
		ATM_STORE_REL (&p_nw->waiting, 0); /* release store */
		nsync_mu_semaphore_v (p_nw->sem);
	}
}